

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affix.c
# Opt level: O1

int affixMain(int argc,char **argv)

{
  char *str;
  char *name;
  char *name_00;
  int iVar1;
  err_t code;
  bool_t bVar2;
  u32 uVar3;
  size_t in_RAX;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  octet *prefix;
  char **ppcVar7;
  long lVar8;
  size_t count;
  size_t local_38;
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  affix prepend <file> <prefix>\n    prepend <prefix> to <file>\n  affix append <file> <suffix>\n    append <suffix> to <file>\n  affix behead <file>\n    delete prefix of <file>\n  affix drop <file>\n    delete suffix of <file>\n  affix extr {-p<n>|-s<n>} <file> <affix>\n    extract object from <file> and store it in <affix>\n      -p<nnn> -- <n>th prefix\n      -s<nnn> -- <n>th suffix\n      \\remark p0 goes first, s0 goes last\n  affix print [field] <file>\n    print <file> info: full info or a specific field\n      full info: lengths and total number of prefixes / suffixes\n      field: {-pc|-sc}\n        -pc -- number of prefixes\n        -sc -- number of suffixes\n"
           ,"affix","file prefixes and suffixes");
    return -1;
  }
  local_38 = in_RAX;
  iVar1 = strCmp(argv[1],"prepend");
  if (iVar1 == 0) {
    code = 0x25b;
    if (argc != 4) goto LAB_001027ec;
    code = cmdFileValExist(2,argv + 2);
    if ((code != 0) ||
       (code = cmdFilePrefixRead((octet *)0x0,&local_38,argv[3],0), sVar4 = local_38, code != 0))
    goto LAB_001027ec;
    sVar6 = cmdFileSize(argv[3]);
    code = 0x132;
    if (sVar4 != sVar6) goto LAB_001027ec;
    prefix = (octet *)blobCreate(local_38);
    if (prefix == (octet *)0x0) goto LAB_00102973;
    code = cmdFilePrefixRead(prefix,&local_38,argv[3],0);
    if (code == 0) {
      code = cmdFilePrepend(argv[2],prefix,local_38);
    }
  }
  else {
    iVar1 = strCmp(argv[1],"append");
    if (iVar1 == 0) {
      code = 0x25b;
      if (argc != 4) goto LAB_001027ec;
      code = cmdFileValExist(2,argv + 2);
      if ((code != 0) ||
         (code = cmdFileSuffixRead((octet *)0x0,&local_38,argv[3],0), sVar4 = local_38, code != 0))
      goto LAB_001027ec;
      sVar6 = cmdFileSize(argv[3]);
      code = 0x132;
      if (sVar4 != sVar6) goto LAB_001027ec;
      prefix = (octet *)blobCreate(local_38);
      if (prefix == (octet *)0x0) goto LAB_00102973;
      code = cmdFileSuffixRead(prefix,&local_38,argv[3],0);
      if (code == 0) {
        code = cmdFileAppend(argv[2],prefix,local_38);
      }
    }
    else {
      iVar1 = strCmp(argv[1],"behead");
      if (iVar1 == 0) {
        code = 0x25b;
        if (argc == 3) {
          ppcVar7 = argv + 2;
          code = cmdFileValExist(1,ppcVar7);
          if ((code == 0) &&
             (code = cmdFilePrefixRead((octet *)0x0,&local_38,*ppcVar7,0), code == 0)) {
            code = cmdFileBehead(*ppcVar7,local_38);
          }
        }
        goto LAB_001027ec;
      }
      iVar1 = strCmp(argv[1],"drop");
      if (iVar1 == 0) {
        code = 0x25b;
        if (argc == 3) {
          ppcVar7 = argv + 2;
          code = cmdFileValExist(1,ppcVar7);
          if ((code == 0) &&
             (code = cmdFileSuffixRead((octet *)0x0,&local_38,*ppcVar7,0), code == 0)) {
            code = cmdFileDrop(*ppcVar7,local_38);
          }
        }
        goto LAB_001027ec;
      }
      iVar1 = strCmp(argv[1],"extr");
      if (iVar1 != 0) {
        iVar1 = strCmp(argv[1],"print");
        code = 0x259;
        if (iVar1 == 0) {
          code = affixPrint(argc + -2,argv + 2);
        }
        goto LAB_001027ec;
      }
      code = 0x25b;
      if (argc != 5) goto LAB_001027ec;
      pcVar5 = argv[2];
      sVar4 = strLen(pcVar5);
      if ((sVar4 == 0) || (*pcVar5 != '-')) goto LAB_001027ec;
      code = cmdFileValExist(1,argv + 3);
      if (code != 0) goto LAB_001027ec;
      code = cmdFileValNotExist(1,argv + 4);
      if (code != 0) goto LAB_001027ec;
      str = pcVar5 + 1;
      name = argv[4];
      name_00 = argv[3];
      bVar2 = strStartsWith(str,"p");
      if ((bVar2 == 0) && (bVar2 = strStartsWith(str,"s"), bVar2 == 0)) {
        code = 0x25b;
        goto LAB_001027ec;
      }
      pcVar5 = pcVar5 + 2;
      bVar2 = decIsValid(pcVar5);
      code = 0x25b;
      if (bVar2 == 0) goto LAB_001027ec;
      sVar4 = strLen(pcVar5);
      sVar6 = decCLZ(pcVar5);
      if (9 < sVar4 - sVar6) goto LAB_001027ec;
      uVar3 = decToU32(pcVar5);
      bVar2 = strStartsWith(str,"p");
      local_38 = 0;
      lVar8 = (ulong)uVar3 + 1;
      sVar4 = 0;
      if (bVar2 == 0) {
        do {
          sVar4 = sVar4 + local_38;
          code = cmdFileSuffixRead((octet *)0x0,&local_38,name_00,sVar4);
          if (code != 0) goto LAB_001027ec;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        prefix = (octet *)blobCreate(local_38);
        if (prefix == (octet *)0x0) goto LAB_00102973;
        code = cmdFileSuffixRead(prefix,&local_38,name_00,sVar4);
      }
      else {
        do {
          sVar4 = sVar4 + local_38;
          code = cmdFilePrefixRead((octet *)0x0,&local_38,name_00,sVar4);
          if (code != 0) goto LAB_001027ec;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        prefix = (octet *)blobCreate(local_38);
        if (prefix == (octet *)0x0) {
LAB_00102973:
          code = 0x6e;
          goto LAB_001027ec;
        }
        code = cmdFilePrefixRead(prefix,&local_38,name_00,sVar4);
      }
      if (code == 0) {
        code = cmdFileWrite(name,prefix,local_38);
      }
    }
  }
  blobClose(prefix);
LAB_001027ec:
  if (code != 0) {
    pcVar5 = errMsg(code);
    printf("bee2cmd/%s: %s\n","affix",pcVar5);
  }
  return -(uint)(code != 0);
}

Assistant:

int affixMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return affixUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "prepend"))
		code = affixPrepend(argc - 1, argv + 1);
	else if (strEq(argv[0], "append"))
		code = affixAppend(argc - 1, argv + 1);
	else if (strEq(argv[0], "behead"))
		code = affixBehead(argc - 1, argv + 1);
	else if (strEq(argv[0], "drop"))
		code = affixDrop(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = affixExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = affixPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK)
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}